

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

ssize_t __thiscall CharConvUCS2::read(CharConvUCS2 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  long lVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  lVar4 = CONCAT44(in_register_00000034,__fd);
  uVar2 = __nbytes & 0xffffffff;
  iVar1 = (**(code **)(*__buf + 0x10))(__buf,lVar4,(long)((int)__nbytes * 2));
  if (iVar1 == 0) {
    puVar5 = (undefined4 *)(lVar4 + (ulong)((int)__nbytes - 1) * 4);
    uVar6 = uVar2 * 2;
    uVar3 = uVar2;
    while( true ) {
      uVar6 = uVar6 - 2;
      if ((int)uVar3 < 2) break;
      uVar2 = (**(code **)(*(long *)this + 0x48))(this,(uVar6 & 0xffffffff) + lVar4);
      *puVar5 = (int)uVar2;
      uVar3 = (ulong)((int)uVar3 - 1);
      puVar5 = puVar5 + -1;
    }
    return uVar2;
  }
  err_throw(0x65);
}

Assistant:

virtual void read(wchar_t *buf, CVmDataSource *src, int cnt)
    {
        /* 
         *   Read the wide characters (two bytes each).  The local wchar_t
         *   type could be bigger than two bytes, but can't be less, so we
         *   can be sure we have enough space for the file read.  
         */
        if (src->read(buf, cnt*2))
            err_throw(VMERR_READ_FILE);

        /* 
         *   Convert each character from little-endian to local byte order.
         *   The local wchar_t type could be bigger than two bytes, so work
         *   from the end of the buffer downwards - this will ensure we won't
         *   overwrite bytes before we translate them. 
         */
        for (int i = cnt - 1 ; i > 0 ; --i)
            buf[i] = file_to_machine((unsigned char *)buf + i*2);
    }